

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDPF.cpp
# Opt level: O3

short * __thiscall EDPF::ComputePrewitt3x3(EDPF *this)

{
  int *piVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  double *pdVar5;
  size_t __n;
  long lVar6;
  short *__s;
  void *__s_00;
  int iVar7;
  uchar *puVar8;
  uchar *puVar9;
  short *psVar10;
  uchar *puVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  
  iVar3 = (this->super_ED).width;
  lVar13 = (long)iVar3;
  iVar4 = (this->super_ED).height;
  lVar6 = iVar4 * lVar13;
  __n = lVar6 * 2;
  uVar12 = 0xffffffffffffffff;
  if (-1 < (int)lVar6) {
    uVar12 = __n;
  }
  __s = (short *)operator_new__(uVar12);
  memset(__s,0,__n);
  __s_00 = operator_new__(0x20000);
  memset(__s_00,0,0x20000);
  if (2 < (long)iVar4) {
    puVar11 = (this->super_ED).smoothImg;
    puVar8 = puVar11 + 2;
    puVar9 = puVar11 + lVar13 * 2 + 2;
    psVar10 = __s + lVar13 + 1;
    puVar11 = puVar11 + lVar13 + 2;
    uVar12 = 1;
    do {
      if (2 < iVar3) {
        lVar6 = 0;
        do {
          iVar14 = ((uint)puVar11[lVar6] + ((uint)puVar8[lVar6] - (uint)puVar9[lVar6 + -2]) +
                   ((uint)puVar9[lVar6] - (uint)puVar8[lVar6 + -2])) - (uint)puVar11[lVar6 + -2];
          iVar7 = -iVar14;
          if (0 < iVar14) {
            iVar7 = iVar14;
          }
          iVar15 = ((uint)puVar9[lVar6 + -1] + ((uint)puVar9[lVar6] - (uint)puVar8[lVar6 + -2])) -
                   ((uint)puVar8[lVar6 + -1] + ((uint)puVar8[lVar6] - (uint)puVar9[lVar6 + -2]));
          iVar14 = -iVar15;
          if (0 < iVar15) {
            iVar14 = iVar15;
          }
          piVar1 = (int *)((long)__s_00 + (ulong)(uint)(iVar14 + iVar7) * 4);
          *piVar1 = *piVar1 + 1;
          psVar10[lVar6] = (short)(iVar14 + iVar7);
          lVar6 = lVar6 + 1;
        } while ((ulong)(iVar3 - 1) - 1 != lVar6);
      }
      uVar12 = uVar12 + 1;
      puVar8 = puVar8 + lVar13;
      puVar9 = puVar9 + lVar13;
      psVar10 = psVar10 + lVar13;
      puVar11 = puVar11 + lVar13;
    } while (uVar12 != iVar4 - 1);
  }
  iVar7 = *(int *)((long)__s_00 + 0x1fffc);
  uVar12 = 0x8000;
  do {
    iVar7 = iVar7 + *(int *)((long)__s_00 + uVar12 * 4 + -8);
    *(int *)((long)__s_00 + uVar12 * 4 + -8) = iVar7;
    uVar12 = uVar12 - 1;
  } while (1 < uVar12);
  pdVar5 = this->H;
  dVar16 = (double)((iVar4 + -2) * (iVar3 + -2));
  lVar6 = 0;
  do {
    uVar2 = *(undefined8 *)((long)__s_00 + lVar6 * 4);
    auVar17._0_8_ = (double)(int)uVar2;
    auVar17._8_8_ = (double)(int)((ulong)uVar2 >> 0x20);
    auVar18._8_8_ = dVar16;
    auVar18._0_8_ = dVar16;
    auVar18 = divpd(auVar17,auVar18);
    *(undefined1 (*) [16])(pdVar5 + lVar6) = auVar18;
    lVar6 = lVar6 + 2;
  } while (lVar6 != 0x8000);
  operator_delete__(__s_00);
  return __s;
}

Assistant:

short * EDPF::ComputePrewitt3x3()
{
	short *gradImg = new short[width*height];
	memset(gradImg, 0, sizeof(short)*width*height);

	int *grads = new int[MAX_GRAD_VALUE];
	memset(grads, 0, sizeof(int)*MAX_GRAD_VALUE);

	for (int i = 1; i<height - 1; i++) {
		for (int j = 1; j<width - 1; j++) {
			// Prewitt Operator in horizontal and vertical direction
			// A B C
			// D x E
			// F G H
			// gx = (C-A) + (E-D) + (H-F)
			// gy = (F-A) + (G-B) + (H-C)
			//
			// To make this faster: 
			// com1 = (H-A)
			// com2 = (C-F)
			// Then: gx = com1 + com2 + (E-D) = (H-A) + (C-F) + (E-D) = (C-A) + (E-D) + (H-F)
			//       gy = com1 - com2 + (G-B) = (H-A) - (C-F) + (G-B) = (F-A) + (G-B) + (H-C)
			// 
			int com1 = smoothImg[(i + 1)*width + j + 1] - smoothImg[(i - 1)*width + j - 1];
			int com2 = smoothImg[(i - 1)*width + j + 1] - smoothImg[(i + 1)*width + j - 1];

			int gx = abs(com1 + com2 + (smoothImg[i*width + j + 1] - smoothImg[i*width + j - 1]));
			int gy = abs(com1 - com2 + (smoothImg[(i + 1)*width + j] - smoothImg[(i - 1)*width + j]));

			int g = gx + gy;

			gradImg[i*width + j] = g;
			grads[g]++;
		} // end-for
	} //end-for

	 // Compute probability function H
	int size = (width - 2)*(height - 2);
	
	for (int i = MAX_GRAD_VALUE - 1; i>0; i--)
		grads[i - 1] += grads[i];
	
	for (int i = 0; i < MAX_GRAD_VALUE; i++)
		H[i] = (double)grads[i] / ((double)size);

	delete[] grads;
	return gradImg;
}